

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Program_FunctionsEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::Clear(MapEntryImpl<CoreML::Specification::MILSpec::Program_FunctionsEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
        *this)

{
  ulong uVar1;
  Arena *pAVar2;
  
  ArenaStringPtr::ClearToEmpty(&this->key_);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  pAVar2 = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    pAVar2 = *(Arena **)pAVar2;
  }
  MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)11,_CoreML::Specification::MILSpec::Function>
  ::Clear(&this->value_,pAVar2);
  *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] & 0xfc;
  return;
}

Assistant:

void Clear() override {
    KeyTypeHandler::Clear(&key_, Base::GetArenaForAllocation());
    ValueTypeHandler::Clear(&value_, Base::GetArenaForAllocation());
    clear_has_key();
    clear_has_value();
  }